

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation_test.cc
# Opt level: O2

void __thiscall
DebugAllocationTest_DeallocMismatch_Test::TestBody(DebugAllocationTest_DeallocMismatch_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  ReturnSentinel RVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  DeathTest DVar6;
  char *regex;
  char *regex_00;
  char *regex_01;
  char *regex_02;
  char *regex_03;
  char *regex_04;
  char *regex_05;
  char *regex_06;
  char *regex_07;
  char *regex_08;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var7;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_158;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_140;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_128;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_110;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_f8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_e0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_b0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_98;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60 [4];
  ReturnSentinel local_40;
  ReturnSentinel gtest_sentinel;
  DeathTest *gtest_dt;
  
  local_60[0]._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)malloc(4);
  (*noopt_helper)(local_60);
  _Var1._M_head_impl = local_60[0]._M_head_impl;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_158,(internal *)"mismatch.*being dealloc.*delete",regex);
    bVar3 = testing::internal::DeathTest::Create
                      ("delete x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_158,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x42,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_158);
    _Var7._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_sentinel;
    if (!bVar3) goto LAB_0010af1e;
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
      RVar2 = gtest_sentinel;
      if (iVar4 == 0) {
        iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*(RVar2.test_)->_vptr_DeathTest[4])(RVar2.test_,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*((DeathTest *)_Var7._M_head_impl)->_vptr_DeathTest[1])(_Var7._M_head_impl);
          goto LAB_0010af1e;
        }
      }
      else if (iVar4 == 1) {
        local_40 = (ReturnSentinel)(ReturnSentinel)gtest_sentinel.test_;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          operator_delete(_Var1._M_head_impl,4);
        }
        (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_40);
      }
      DVar6 = (DeathTest)((DeathTest *)_Var7._M_head_impl)->_vptr_DeathTest;
      goto LAB_0010af67;
    }
  }
  else {
LAB_0010af1e:
    testing::Message::Message((Message *)local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x42,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (local_60[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar6._vptr_DeathTest = *(_func_int ***)local_60[0]._M_head_impl;
      _Var7._M_head_impl = local_60[0]._M_head_impl;
LAB_0010af67:
      (*DVar6._vptr_DeathTest[1])(_Var7._M_head_impl);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_140,(internal *)"mismatch.*being dealloc.*delete *[[]",regex_00);
    bVar3 = testing::internal::DeathTest::Create
                      ("delete [] x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_140,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x43,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_140);
    _Var7._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_sentinel;
    if (!bVar3) goto LAB_0010b04f;
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
      RVar2 = gtest_sentinel;
      if (iVar4 == 0) {
        iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*(RVar2.test_)->_vptr_DeathTest[4])(RVar2.test_,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*((DeathTest *)_Var7._M_head_impl)->_vptr_DeathTest[1])(_Var7._M_head_impl);
          goto LAB_0010b04f;
        }
      }
      else if (iVar4 == 1) {
        local_40 = (ReturnSentinel)(ReturnSentinel)gtest_sentinel.test_;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3 && _Var1._M_head_impl !=
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          operator_delete__(_Var1._M_head_impl);
        }
        (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_40);
      }
      DVar6 = (DeathTest)((DeathTest *)_Var7._M_head_impl)->_vptr_DeathTest;
      goto LAB_0010b098;
    }
  }
  else {
LAB_0010b04f:
    testing::Message::Message((Message *)local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x43,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (local_60[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar6._vptr_DeathTest = *(_func_int ***)local_60[0]._M_head_impl;
      _Var7._M_head_impl = local_60[0]._M_head_impl;
LAB_0010b098:
      (*DVar6._vptr_DeathTest[1])(_Var7._M_head_impl);
    }
  }
  free(_Var1._M_head_impl);
  local_60[0]._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(4);
  (*noopt_helper)(local_60);
  _Var1._M_head_impl = local_60[0]._M_head_impl;
  local_60[0]._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(4);
  (*noopt_helper)(local_60);
  _Var7._M_head_impl = local_60[0]._M_head_impl;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_128,(internal *)"mismatch.*being dealloc.*free",regex_01);
    bVar3 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_128,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x4c,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_128);
    _Var8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_sentinel;
    if (!bVar3) goto LAB_0010b1c2;
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
      RVar2 = gtest_sentinel;
      if (iVar4 == 0) {
        iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*(RVar2.test_)->_vptr_DeathTest[4])(RVar2.test_,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest[1])(_Var8._M_head_impl);
          goto LAB_0010b1c2;
        }
      }
      else if (iVar4 == 1) {
        local_40 = (ReturnSentinel)(ReturnSentinel)gtest_sentinel.test_;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          free(_Var1._M_head_impl);
        }
        (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_40);
      }
      DVar6 = (DeathTest)((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest;
      goto LAB_0010b20b;
    }
  }
  else {
LAB_0010b1c2:
    testing::Message::Message((Message *)local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x4c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (local_60[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar6._vptr_DeathTest = *(_func_int ***)local_60[0]._M_head_impl;
      _Var8._M_head_impl = local_60[0]._M_head_impl;
LAB_0010b20b:
      (*DVar6._vptr_DeathTest[1])(_Var8._M_head_impl);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_110,(internal *)"mismatch.*being dealloc.*delete *[[]",regex_02);
    bVar3 = testing::internal::DeathTest::Create
                      ("delete [] x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_110,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x4d,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_110);
    _Var8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_sentinel;
    if (!bVar3) goto LAB_0010b2f5;
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
      RVar2 = gtest_sentinel;
      if (iVar4 == 0) {
        iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*(RVar2.test_)->_vptr_DeathTest[4])(RVar2.test_,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest[1])(_Var8._M_head_impl);
          goto LAB_0010b2f5;
        }
      }
      else if (iVar4 == 1) {
        local_40 = (ReturnSentinel)(ReturnSentinel)gtest_sentinel.test_;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3 && _Var1._M_head_impl !=
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          operator_delete__(_Var1._M_head_impl);
        }
        (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_40);
      }
      DVar6 = (DeathTest)((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest;
      goto LAB_0010b33e;
    }
  }
  else {
LAB_0010b2f5:
    testing::Message::Message((Message *)local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x4d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (local_60[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar6._vptr_DeathTest = *(_func_int ***)local_60[0]._M_head_impl;
      _Var8._M_head_impl = local_60[0]._M_head_impl;
LAB_0010b33e:
      (*DVar6._vptr_DeathTest[1])(_Var8._M_head_impl);
    }
  }
  operator_delete(_Var1._M_head_impl,4);
  operator_delete(_Var7._M_head_impl,(nothrow_t *)&std::nothrow);
  local_60[0]._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new__(4);
  (*noopt_helper)(local_60);
  _Var1._M_head_impl = local_60[0]._M_head_impl;
  local_60[0]._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new__(4);
  (*noopt_helper)(local_60);
  _Var7._M_head_impl = local_60[0]._M_head_impl;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_f8,(internal *)"mismatch.*being dealloc.*free",regex_03);
    bVar3 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_f8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x56,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_f8);
    _Var8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_sentinel;
    if (!bVar3) goto LAB_0010b476;
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
      RVar2 = gtest_sentinel;
      if (iVar4 == 0) {
        iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*(RVar2.test_)->_vptr_DeathTest[4])(RVar2.test_,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest[1])(_Var8._M_head_impl);
          goto LAB_0010b476;
        }
      }
      else if (iVar4 == 1) {
        local_40 = (ReturnSentinel)(ReturnSentinel)gtest_sentinel.test_;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          free(_Var1._M_head_impl);
        }
        (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_40);
      }
      DVar6 = (DeathTest)((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest;
      goto LAB_0010b4bf;
    }
  }
  else {
LAB_0010b476:
    testing::Message::Message((Message *)local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x56,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (local_60[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar6._vptr_DeathTest = *(_func_int ***)local_60[0]._M_head_impl;
      _Var8._M_head_impl = local_60[0]._M_head_impl;
LAB_0010b4bf:
      (*DVar6._vptr_DeathTest[1])(_Var8._M_head_impl);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_e0,(internal *)"mismatch.*being dealloc.*delete",regex_04);
    bVar3 = testing::internal::DeathTest::Create
                      ("delete x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_e0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x57,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_e0);
    _Var8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_sentinel;
    if (!bVar3) goto LAB_0010b5a4;
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
      RVar2 = gtest_sentinel;
      if (iVar4 == 0) {
        iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*(RVar2.test_)->_vptr_DeathTest[4])(RVar2.test_,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest[1])(_Var8._M_head_impl);
          goto LAB_0010b5a4;
        }
      }
      else if (iVar4 == 1) {
        local_40 = (ReturnSentinel)(ReturnSentinel)gtest_sentinel.test_;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          operator_delete(_Var1._M_head_impl,4);
        }
        (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_40);
      }
      DVar6 = (DeathTest)((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest;
      goto LAB_0010b5ed;
    }
  }
  else {
LAB_0010b5a4:
    testing::Message::Message((Message *)local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x57,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (local_60[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar6._vptr_DeathTest = *(_func_int ***)local_60[0]._M_head_impl;
      _Var8._M_head_impl = local_60[0]._M_head_impl;
LAB_0010b5ed:
      (*DVar6._vptr_DeathTest[1])(_Var8._M_head_impl);
    }
  }
  if (_Var1._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(_Var1._M_head_impl);
  }
  operator_delete__(_Var7._M_head_impl,(nothrow_t *)&std::nothrow);
  local_60[0]._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       operator_new(4,(nothrow_t *)&std::nothrow);
  (*noopt_helper)(local_60);
  _Var1._M_head_impl = local_60[0]._M_head_impl;
  local_60[0]._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       operator_new(4,(nothrow_t *)&std::nothrow);
  (*noopt_helper)(local_60);
  _Var7._M_head_impl = local_60[0]._M_head_impl;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_c8,(internal *)"mismatch.*being dealloc.*free",regex_05);
    bVar3 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_c8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x60,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_c8);
    _Var8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_sentinel;
    if (!bVar3) goto LAB_0010b737;
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
      RVar2 = gtest_sentinel;
      if (iVar4 == 0) {
        iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*(RVar2.test_)->_vptr_DeathTest[4])(RVar2.test_,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest[1])(_Var8._M_head_impl);
          goto LAB_0010b737;
        }
      }
      else if (iVar4 == 1) {
        local_40 = (ReturnSentinel)(ReturnSentinel)gtest_sentinel.test_;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          free(_Var1._M_head_impl);
        }
        (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_40);
      }
      DVar6 = (DeathTest)((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest;
      goto LAB_0010b780;
    }
  }
  else {
LAB_0010b737:
    testing::Message::Message((Message *)local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x60,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (local_60[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar6._vptr_DeathTest = *(_func_int ***)local_60[0]._M_head_impl;
      _Var8._M_head_impl = local_60[0]._M_head_impl;
LAB_0010b780:
      (*DVar6._vptr_DeathTest[1])(_Var8._M_head_impl);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_b0,(internal *)"mismatch.*being dealloc.*delete *[[]",regex_06);
    bVar3 = testing::internal::DeathTest::Create
                      ("delete [] x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_b0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x61,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_b0);
    _Var8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_sentinel;
    if (!bVar3) goto LAB_0010b86a;
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
      RVar2 = gtest_sentinel;
      if (iVar4 == 0) {
        iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*(RVar2.test_)->_vptr_DeathTest[4])(RVar2.test_,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest[1])(_Var8._M_head_impl);
          goto LAB_0010b86a;
        }
      }
      else if (iVar4 == 1) {
        local_40 = (ReturnSentinel)(ReturnSentinel)gtest_sentinel.test_;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3 && _Var1._M_head_impl !=
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          operator_delete__(_Var1._M_head_impl);
        }
        (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_40);
      }
      DVar6 = (DeathTest)((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest;
      goto LAB_0010b8b3;
    }
  }
  else {
LAB_0010b86a:
    testing::Message::Message((Message *)local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x61,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (local_60[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar6._vptr_DeathTest = *(_func_int ***)local_60[0]._M_head_impl;
      _Var8._M_head_impl = local_60[0]._M_head_impl;
LAB_0010b8b3:
      (*DVar6._vptr_DeathTest[1])(_Var8._M_head_impl);
    }
  }
  operator_delete(_Var1._M_head_impl,4);
  operator_delete(_Var7._M_head_impl,(nothrow_t *)&std::nothrow);
  local_60[0]._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       operator_new__(4,(nothrow_t *)&std::nothrow);
  (*noopt_helper)(local_60);
  _Var1._M_head_impl = local_60[0]._M_head_impl;
  local_60[0]._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       operator_new__(4,(nothrow_t *)&std::nothrow);
  (*noopt_helper)(local_60);
  _Var7._M_head_impl = local_60[0]._M_head_impl;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_98,(internal *)"mismatch.*being dealloc.*free",regex_07);
    bVar3 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_98,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x6a,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_98);
    _Var8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_sentinel;
    if (!bVar3) goto LAB_0010b9f4;
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
      RVar2 = gtest_sentinel;
      if (iVar4 == 0) {
        iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*(RVar2.test_)->_vptr_DeathTest[4])(RVar2.test_,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest[1])(_Var8._M_head_impl);
          goto LAB_0010b9f4;
        }
      }
      else if (iVar4 == 1) {
        local_40 = (ReturnSentinel)(ReturnSentinel)gtest_sentinel.test_;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          free(_Var1._M_head_impl);
        }
        (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_40);
      }
      DVar6 = (DeathTest)((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest;
      goto LAB_0010ba3d;
    }
  }
  else {
LAB_0010b9f4:
    testing::Message::Message((Message *)local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x6a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (local_60[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar6._vptr_DeathTest = *(_func_int ***)local_60[0]._M_head_impl;
      _Var8._M_head_impl = local_60[0]._M_head_impl;
LAB_0010ba3d:
      (*DVar6._vptr_DeathTest[1])(_Var8._M_head_impl);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_80,(internal *)"mismatch.*being dealloc.*delete",regex_08);
    bVar3 = testing::internal::DeathTest::Create
                      ("delete x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_80,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x6b,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_80);
    _Var8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_sentinel;
    if (!bVar3) goto LAB_0010bb1c;
    if (gtest_sentinel.test_ == (DeathTest *)0x0) goto LAB_0010bb68;
    iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
    if (iVar4 == 0) {
      iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
      bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
      iVar4 = (*(gtest_sentinel.test_)->_vptr_DeathTest[4])(gtest_sentinel.test_,(ulong)bVar3);
      if ((char)iVar4 == '\0') {
        (*((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest[1])(_Var8._M_head_impl);
        goto LAB_0010bb1c;
      }
    }
    else if (iVar4 == 1) {
      local_40 = (ReturnSentinel)(ReturnSentinel)gtest_sentinel.test_;
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        operator_delete(_Var1._M_head_impl,4);
      }
      (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_40);
    }
    DVar6 = (DeathTest)((DeathTest *)_Var8._M_head_impl)->_vptr_DeathTest;
  }
  else {
LAB_0010bb1c:
    testing::Message::Message((Message *)local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x6b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (local_60[0]._M_head_impl ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0010bb68;
    DVar6._vptr_DeathTest = *(_func_int ***)local_60[0]._M_head_impl;
    _Var8._M_head_impl = local_60[0]._M_head_impl;
  }
  (*DVar6._vptr_DeathTest[1])(_Var8._M_head_impl);
LAB_0010bb68:
  if (_Var1._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(_Var1._M_head_impl);
  }
  operator_delete__(_Var7._M_head_impl,(nothrow_t *)&std::nothrow);
  return;
}

Assistant:

TEST(DebugAllocationTest, DeallocMismatch) {
  // malloc can be matched only by free
  // new can be matched only by delete and delete(nothrow)
  // new[] can be matched only by delete[] and delete[](nothrow)
  // new(nothrow) can be matched only by delete and delete(nothrow)
  // new(nothrow)[] can be matched only by delete[] and delete[](nothrow)

  // Allocate with malloc.
  {
    int* x = static_cast<int*>(noopt(malloc(sizeof(*x))));
    EXPECT_DEATH(delete x, "mismatch.*being dealloc.*delete");
    EXPECT_DEATH(delete [] x, "mismatch.*being dealloc.*delete *[[]");
    // Should work fine.
    free(x);
  }

  // Allocate with new.
  {
    int* x = noopt(new int);
    int* y = noopt(new int);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete [] x, "mismatch.*being dealloc.*delete *[[]");
    delete x;
    ::operator delete(y, std::nothrow);
  }

  // Allocate with new[].
  {
    int* x = noopt(new int[1]);
    int* y = noopt(new int[1]);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete x, "mismatch.*being dealloc.*delete");
    delete [] x;
    ::operator delete[](y, std::nothrow);
  }

  // Allocate with new(nothrow).
  {
    int* x = noopt(new (std::nothrow) int);
    int* y = noopt(new (std::nothrow) int);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete [] x, "mismatch.*being dealloc.*delete *[[]");
    delete x;
    ::operator delete(y, std::nothrow);
  }

  // Allocate with new(nothrow)[].
  {
    int* x = noopt(new (std::nothrow) int[1]);
    int* y = noopt(new (std::nothrow) int[1]);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete x, "mismatch.*being dealloc.*delete");
    delete [] x;
    ::operator delete[](y, std::nothrow);
  }
}